

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int cost_mv_ref(ModeCosts *mode_costs,PREDICTION_MODE mode,int16_t mode_context)

{
  ushort uVar1;
  int iVar2;
  ushort in_DX;
  byte in_SIL;
  long in_RDI;
  int16_t mode_ctx;
  int mode_cost;
  undefined4 local_4;
  
  iVar2 = is_inter_compound_mode(in_SIL);
  if (iVar2 == 0) {
    if (in_SIL == 0x10) {
      local_4 = *(int *)(in_RDI + 0x3cb8 + (long)(short)(in_DX & 7) * 8);
    }
    else {
      local_4 = *(int *)(in_RDI + 0x3cbc + (long)(short)(in_DX & 7) * 8);
      uVar1 = (short)in_DX >> 3 & 1;
      if (in_SIL == 0xf) {
        local_4 = *(int *)(in_RDI + 0x3ce8 + (long)(short)uVar1 * 8) + local_4;
      }
      else {
        local_4 = *(int *)(in_RDI + 0x3cf8 + (long)(short)((short)in_DX >> 4 & 0xf) * 8 +
                          (long)(int)(uint)(in_SIL != 0xd) * 4) +
                  *(int *)(in_RDI + 0x3cec + (long)(short)uVar1 * 8) + local_4;
      }
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0x3f38 + (long)(short)in_DX * 0x20 +
                      (ulong)(in_SIL - 0x11 & 0xff) * 4);
  }
  return local_4;
}

Assistant:

static int cost_mv_ref(const ModeCosts *const mode_costs, PREDICTION_MODE mode,
                       int16_t mode_context) {
  if (is_inter_compound_mode(mode)) {
    return mode_costs
        ->inter_compound_mode_cost[mode_context][INTER_COMPOUND_OFFSET(mode)];
  }

  int mode_cost = 0;
  int16_t mode_ctx = mode_context & NEWMV_CTX_MASK;

  assert(is_inter_mode(mode));

  if (mode == NEWMV) {
    mode_cost = mode_costs->newmv_mode_cost[mode_ctx][0];
    return mode_cost;
  } else {
    mode_cost = mode_costs->newmv_mode_cost[mode_ctx][1];
    mode_ctx = (mode_context >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;

    if (mode == GLOBALMV) {
      mode_cost += mode_costs->zeromv_mode_cost[mode_ctx][0];
      return mode_cost;
    } else {
      mode_cost += mode_costs->zeromv_mode_cost[mode_ctx][1];
      mode_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;
      mode_cost += mode_costs->refmv_mode_cost[mode_ctx][mode != NEARESTMV];
      return mode_cost;
    }
  }
}